

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O0

void __thiscall
GraphViewer::initialize(GraphViewer *this,int width,int height,bool dynamic,int port_n)

{
  __pid_t __pid;
  char *pcVar1;
  Connection *pCVar2;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [8];
  string str;
  char local_2c8 [8];
  char buff [200];
  string port_string;
  stringstream local_1e0 [8];
  stringstream ss;
  ostream local_1d0 [399];
  allocator local_41;
  string local_40 [8];
  string command;
  short local_20;
  int port_n_local;
  bool dynamic_local;
  int height_local;
  int width_local;
  GraphViewer *this_local;
  
  this->width = width;
  this->height = height;
  this->isDynamic = dynamic;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"java -jar ../src/GraphViewer/GraphViewerController.jar",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::stringstream::stringstream(local_1e0);
  std::ostream::operator<<(local_1d0,port_n);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator+=(local_40," --port ");
  std::__cxx11::string::operator+=(local_40,(string *)(buff + 0xc0));
  procId = fork();
  if (procId == 0) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    system(pcVar1);
    __pid = getppid();
    kill(__pid,2);
    exit(0);
  }
  usleep(2000000);
  pCVar2 = (Connection *)operator_new(4);
  local_20 = (short)port_n;
  Connection::Connection(pCVar2,local_20);
  this->con = pCVar2;
  pcVar1 = "false";
  if (dynamic) {
    pcVar1 = "true";
  }
  sprintf(local_2c8,"newGraph %d %d %s\n",(ulong)(uint)width,(ulong)(uint)height,pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,local_2c8,&local_2e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  pCVar2 = this->con;
  std::__cxx11::string::string(local_310,local_2e8);
  Connection::sendMsg(pCVar2,(string *)local_310);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string((string *)(buff + 0xc0));
  std::__cxx11::stringstream::~stringstream(local_1e0);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void GraphViewer::initialize(int width, int height, bool dynamic, int port_n) {
	this->width = width;
	this->height = height;
	this->isDynamic = dynamic;
	string command = "java -jar ../src/GraphViewer/GraphViewerController.jar";
	std::stringstream ss;
	ss << port_n;
	string port_string = ss.str();
	command += " --port ";
	command += port_string;

#if defined(__linux__) || defined(__APPLE__)
	if (!(procId = fork())) {
		system(command.c_str());
		kill(getppid(), SIGINT);
		exit(0);
	}
	else {
		usleep(2000000);
		con = new Connection(port_n);

		char buff[200];
		sprintf(buff, "newGraph %d %d %s\n", width, height, (dynamic?"true":"false"));
		string str(buff);
		con->sendMsg(str);
	}
#else
	STARTUPINFO si;
	PROCESS_INFORMATION pi;
	ZeroMemory( &si, sizeof(si) );
	si.cb = sizeof(si);
	ZeroMemory( &pi, sizeof(pi) );
	LPSTR command_lpstr = const_cast<char *>(command.c_str());
	if( !CreateProcess( NULL,   // No module name (use command line)
			command_lpstr,        // Command line
			NULL,           // Process handle not inheritable
			NULL,           // Thread handle not inheritable
			FALSE,          // Set handle inheritance to FALSE
			0,              // No creation flags
			NULL,           // Use parent's environment block
			NULL,           // Use parent's starting directory
			&si,            // Pointer to STARTUPINFO structure
			&pi )           // Pointer to PROCESS_INFORMATION structure
	) {
		cerr << "CreateProcess failed " << GetLastError() << endl;
		return;
	}

	// Close process and thread handles.
	CloseHandle( pi.hProcess );
	CloseHandle( pi.hThread );

	Sleep(2000);
	con = new Connection(port_n);

	char buff[200];
	sprintf(buff, "newGraph %d %d %s\n", width, height, (dynamic?"true":"false"));
	string str(buff);
	con->sendMsg(str);
#endif

}